

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O3

vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
* libcellml::attributesWithCellml1XNamespace
            (vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
             *__return_storage_ptr__,XmlNodePtr *node)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  size_type sVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  XmlAttributePtr tempAttribute;
  vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
  subAttributes;
  value_type local_98;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  string local_78;
  string local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar1 = (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (peVar1 != (element_type *)0x0) {
    local_88 = peVar1;
    local_80 = this_00;
    do {
      XmlNode::firstAttribute((XmlNode *)&local_98);
      while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_98.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) {
        XmlAttribute::namespaceUri_abi_cxx11_
                  (&local_78,
                   local_98.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        iVar3 = std::__cxx11::string::compare((char *)&local_78);
        if (iVar3 == 0) {
          bVar4 = true;
        }
        else {
          XmlAttribute::namespaceUri_abi_cxx11_
                    (&local_58,
                     local_98.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          iVar3 = std::__cxx11::string::compare((char *)&local_58);
          bVar4 = iVar3 == 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (bVar4) {
          std::
          vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
          ::push_back(__return_storage_ptr__,&local_98);
        }
        XmlAttribute::next((XmlAttribute *)&local_78);
        sVar2 = local_78._M_string_length;
        local_98.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_78._M_dataplus._M_p;
        this._M_pi = local_98.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
        local_98.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length;
        local_78._M_dataplus._M_p = (pointer)0x0;
        local_78._M_string_length = 0;
        if ((this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
        }
      }
      XmlNode::firstChild((XmlNode *)&local_58);
      attributesWithCellml1XNamespace
                ((vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
                  *)&local_78,(XmlNodePtr *)&local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      std::
      vector<std::shared_ptr<libcellml::XmlAttribute>,std::allocator<std::shared_ptr<libcellml::XmlAttribute>>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::XmlAttribute>*,std::vector<std::shared_ptr<libcellml::XmlAttribute>,std::allocator<std::shared_ptr<libcellml::XmlAttribute>>>>>
                ((vector<std::shared_ptr<libcellml::XmlAttribute>,std::allocator<std::shared_ptr<libcellml::XmlAttribute>>>
                  *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,local_78._M_dataplus._M_p,
                 local_78._M_string_length);
      XmlNode::next((XmlNode *)&local_58);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length;
      local_88 = (element_type *)local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      if ((local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      std::
      vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
      ::~vector((vector<std::shared_ptr<libcellml::XmlAttribute>,_std::allocator<std::shared_ptr<libcellml::XmlAttribute>_>_>
                 *)&local_78);
      if (local_98.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_80 = this_00;
    } while (local_88 != (element_type *)0x0);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XmlAttributePtr> attributesWithCellml1XNamespace(const XmlNodePtr &node)
{
    std::vector<XmlAttributePtr> attributes;

    auto tempNode = node;
    while (tempNode != nullptr) {
        auto tempAttribute = tempNode->firstAttribute();
        // Find attributes using old CellML namespace.
        while (tempAttribute != nullptr) {
            if (tempAttribute->namespaceUri() == CELLML_1_0_NS || tempAttribute->namespaceUri() == CELLML_1_1_NS) {
                attributes.push_back(tempAttribute);
            }
            tempAttribute = tempAttribute->next();
        }

        auto subAttributes = attributesWithCellml1XNamespace(tempNode->firstChild());

        // Append attributes found on child nodes.
        attributes.insert(attributes.end(), subAttributes.begin(), subAttributes.end());

        tempNode = tempNode->next();
    }

    return attributes;
}